

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_ssse3.c
# Opt level: O1

void cfl_predict_lbd_16x16_ssse3(int16_t *pred_buf_q3,uint8_t *dst,int dst_stride,int alpha_q3)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  short sVar6;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar7 [16];
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  short sVar19;
  short sVar20;
  short sVar21;
  short sVar22;
  undefined1 auVar23 [16];
  
  auVar3 = pshuflw(ZEXT416((uint)alpha_q3),ZEXT416((uint)alpha_q3),0);
  auVar3._4_4_ = auVar3._0_4_;
  auVar3._8_4_ = auVar3._0_4_;
  auVar3._12_4_ = auVar3._0_4_;
  auVar4 = pabsw(in_XMM1,auVar3);
  auVar4 = psllw(auVar4,9);
  auVar5 = pshuflw(ZEXT116(*dst),ZEXT116(*dst),0);
  uVar2 = 0xffffffffffffffc0;
  do {
    auVar7 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x40);
    auVar1 = *(undefined1 (*) [16])((long)pred_buf_q3 + uVar2 + 0x50);
    auVar23 = psignw(auVar3,auVar7);
    auVar7 = pabsw(auVar7,auVar7);
    auVar7 = pmulhrsw(auVar7,auVar4);
    auVar7 = psignw(auVar7,auVar23);
    sVar21 = auVar5._0_2_;
    sVar6 = auVar7._0_2_ + sVar21;
    sVar22 = auVar5._2_2_;
    sVar8 = auVar7._2_2_ + sVar22;
    sVar9 = auVar7._4_2_ + sVar21;
    sVar10 = auVar7._6_2_ + sVar22;
    sVar11 = auVar7._8_2_ + sVar21;
    sVar12 = auVar7._10_2_ + sVar22;
    sVar13 = auVar7._12_2_ + sVar21;
    sVar14 = auVar7._14_2_ + sVar22;
    auVar23 = psignw(auVar3,auVar1);
    auVar7 = pabsw(auVar1,auVar1);
    auVar7 = pmulhrsw(auVar7,auVar4);
    auVar7 = psignw(auVar7,auVar23);
    sVar15 = auVar7._0_2_ + sVar21;
    sVar16 = auVar7._2_2_ + sVar22;
    sVar17 = auVar7._4_2_ + sVar21;
    sVar18 = auVar7._6_2_ + sVar22;
    sVar19 = auVar7._8_2_ + sVar21;
    sVar20 = auVar7._10_2_ + sVar22;
    sVar21 = auVar7._12_2_ + sVar21;
    sVar22 = auVar7._14_2_ + sVar22;
    *dst = (0 < sVar6) * (sVar6 < 0x100) * (char)sVar6 - (0xff < sVar6);
    dst[1] = (0 < sVar8) * (sVar8 < 0x100) * (char)sVar8 - (0xff < sVar8);
    dst[2] = (0 < sVar9) * (sVar9 < 0x100) * (char)sVar9 - (0xff < sVar9);
    dst[3] = (0 < sVar10) * (sVar10 < 0x100) * (char)sVar10 - (0xff < sVar10);
    dst[4] = (0 < sVar11) * (sVar11 < 0x100) * (char)sVar11 - (0xff < sVar11);
    dst[5] = (0 < sVar12) * (sVar12 < 0x100) * (char)sVar12 - (0xff < sVar12);
    dst[6] = (0 < sVar13) * (sVar13 < 0x100) * (char)sVar13 - (0xff < sVar13);
    dst[7] = (0 < sVar14) * (sVar14 < 0x100) * (char)sVar14 - (0xff < sVar14);
    dst[8] = (0 < sVar15) * (sVar15 < 0x100) * (char)sVar15 - (0xff < sVar15);
    dst[9] = (0 < sVar16) * (sVar16 < 0x100) * (char)sVar16 - (0xff < sVar16);
    dst[10] = (0 < sVar17) * (sVar17 < 0x100) * (char)sVar17 - (0xff < sVar17);
    dst[0xb] = (0 < sVar18) * (sVar18 < 0x100) * (char)sVar18 - (0xff < sVar18);
    dst[0xc] = (0 < sVar19) * (sVar19 < 0x100) * (char)sVar19 - (0xff < sVar19);
    dst[0xd] = (0 < sVar20) * (sVar20 < 0x100) * (char)sVar20 - (0xff < sVar20);
    dst[0xe] = (0 < sVar21) * (sVar21 < 0x100) * (char)sVar21 - (0xff < sVar21);
    dst[0xf] = (0 < sVar22) * (sVar22 < 0x100) * (char)sVar22 - (0xff < sVar22);
    dst = dst + dst_stride;
    uVar2 = uVar2 + 0x40;
  } while (uVar2 < 0x3c0);
  return;
}

Assistant:

static inline void cfl_predict_lbd_ssse3(const int16_t *pred_buf_q3,
                                         uint8_t *dst, int dst_stride,
                                         int alpha_q3, int width, int height) {
  const __m128i alpha_sign = _mm_set1_epi16(alpha_q3);
  const __m128i alpha_q12 = _mm_slli_epi16(_mm_abs_epi16(alpha_sign), 9);
  const __m128i dc_q0 = _mm_set1_epi16(*dst);
  __m128i *row = (__m128i *)pred_buf_q3;
  const __m128i *row_end = row + height * CFL_BUF_LINE_I128;
  do {
    __m128i res = predict_unclipped(row, alpha_q12, alpha_sign, dc_q0);
    if (width < 16) {
      res = _mm_packus_epi16(res, res);
      if (width == 4)
        _mm_storeh_epi32((__m128i *)dst, res);
      else
        _mm_storel_epi64((__m128i *)dst, res);
    } else {
      __m128i next = predict_unclipped(row + 1, alpha_q12, alpha_sign, dc_q0);
      res = _mm_packus_epi16(res, next);
      _mm_storeu_si128((__m128i *)dst, res);
      if (width == 32) {
        res = predict_unclipped(row + 2, alpha_q12, alpha_sign, dc_q0);
        next = predict_unclipped(row + 3, alpha_q12, alpha_sign, dc_q0);
        res = _mm_packus_epi16(res, next);
        _mm_storeu_si128((__m128i *)(dst + 16), res);
      }
    }
    dst += dst_stride;
  } while ((row += CFL_BUF_LINE_I128) < row_end);
}